

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O1

longlong GeneratedSaxParser::Utils::toInteger<long_long,true>(ParserChar *buffer,bool *failed)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ParserChar *s;
  byte *pbVar5;
  byte bVar6;
  
  if ((buffer != (ParserChar *)0x0) && (*buffer != '\0')) {
    pbVar5 = (byte *)(buffer + 1);
    do {
      uVar3 = (ulong)pbVar5[-1];
      if (0x2d < uVar3) {
LAB_0082fb81:
        pbVar5 = pbVar5 + -1;
LAB_0082fb84:
        lVar4 = 1;
LAB_0082fb89:
        bVar6 = *pbVar5;
        if (bVar6 == 0) {
          lVar2 = 0;
          goto LAB_0082fbd1;
        }
        bVar1 = bVar6 - 0x30;
        if (9 < bVar1) {
          lVar2 = 0;
          goto LAB_0082fbcc;
        }
        lVar2 = 0;
        goto LAB_0082fb9f;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
        if (uVar3 == 0x2b) goto LAB_0082fb84;
        if (uVar3 != 0x2d) goto LAB_0082fb81;
        lVar4 = -1;
        goto LAB_0082fb89;
      }
      bVar6 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar6 != 0);
  }
  goto LAB_0082fb66;
  while ((byte)(bVar6 - 0x30) < 10) {
LAB_0082fb9f:
    pbVar5 = pbVar5 + 1;
    lVar2 = (ulong)bVar6 + lVar2 * 10 + -0x30;
    bVar6 = *pbVar5;
    if (bVar6 == 0) goto LAB_0082fbd1;
  }
LAB_0082fbcc:
  if (bVar1 < 10) {
LAB_0082fbd1:
    *failed = false;
    return lVar2 * lVar4;
  }
LAB_0082fb66:
  *failed = true;
  return 0;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}